

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::IPCFrame_BindServiceReply::~IPCFrame_BindServiceReply
          (IPCFrame_BindServiceReply *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_BindServiceReply_00409a20;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo,_std::allocator<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo>_>
  ::~vector(&this->methods_);
  return;
}

Assistant:

IPCFrame_BindServiceReply::~IPCFrame_BindServiceReply() = default;